

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_UINT32
opj_tcd_get_decoded_tile_size(opj_tcd_t *p_tcd,OPJ_BOOL take_into_account_partial_decoding)

{
  uint uVar1;
  long lVar2;
  uint local_54;
  uint local_50;
  OPJ_UINT32 h;
  OPJ_UINT32 w;
  OPJ_UINT32 l_temp;
  OPJ_UINT32 l_remaining;
  OPJ_UINT32 l_size_comp;
  opj_tcd_resolution_t *l_res;
  opj_tcd_tilecomp_t *l_tile_comp;
  opj_image_comp_t *l_img_comp;
  uint local_20;
  OPJ_UINT32 l_data_size;
  OPJ_UINT32 i;
  OPJ_BOOL take_into_account_partial_decoding_local;
  opj_tcd_t *p_tcd_local;
  
  l_img_comp._4_4_ = 0;
  l_res = (opj_tcd_resolution_t *)p_tcd->tcd_image->tiles->comps;
  l_tile_comp = (opj_tcd_tilecomp_t *)p_tcd->image->comps;
  local_20 = 0;
  while( true ) {
    if (p_tcd->image->numcomps <= local_20) {
      return l_img_comp._4_4_;
    }
    l_temp = l_tile_comp->minimum_num_resolutions >> 3;
    if ((l_tile_comp->minimum_num_resolutions & 7) != 0) {
      l_temp = l_temp + 1;
    }
    if (l_temp == 3) {
      l_temp = 4;
    }
    lVar2 = *(long *)l_res->bands + (ulong)l_res->numbands * 0xc0;
    if ((take_into_account_partial_decoding == 0) || (p_tcd->whole_tile_decoding != 0)) {
      local_50 = *(int *)(lVar2 + -0xb8) - *(int *)(lVar2 + -0xc0);
      local_54 = *(int *)(lVar2 + -0xb4) - *(int *)(lVar2 + -0xbc);
    }
    else {
      local_50 = *(int *)(lVar2 + -8) - *(int *)(lVar2 + -0x10);
      local_54 = *(int *)(lVar2 + -4) - *(int *)(lVar2 + -0xc);
    }
    if ((local_54 != 0) && ((uint)(0xffffffff / (ulong)local_50) < local_54)) break;
    if ((l_temp != 0) && ((uint)(0xffffffff / (ulong)l_temp) < local_50 * local_54)) {
      return 0xffffffff;
    }
    uVar1 = l_temp * local_50 * local_54;
    if (-l_img_comp._4_4_ - 1 < uVar1) {
      return 0xffffffff;
    }
    l_img_comp._4_4_ = uVar1 + l_img_comp._4_4_;
    l_tile_comp = (opj_tcd_tilecomp_t *)&l_tile_comp->data_size_needed;
    l_res = (opj_tcd_resolution_t *)&l_res->bands[1].precincts_data_size;
    local_20 = local_20 + 1;
  }
  return 0xffffffff;
}

Assistant:

OPJ_UINT32 opj_tcd_get_decoded_tile_size(opj_tcd_t *p_tcd,
        OPJ_BOOL take_into_account_partial_decoding)
{
    OPJ_UINT32 i;
    OPJ_UINT32 l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tile_comp = 00;
    opj_tcd_resolution_t * l_res = 00;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_UINT32 l_temp;

    l_tile_comp = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;

    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        OPJ_UINT32 w, h;
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        l_res = l_tile_comp->resolutions + l_tile_comp->minimum_num_resolutions - 1;
        if (take_into_account_partial_decoding && !p_tcd->whole_tile_decoding) {
            w = l_res->win_x1 - l_res->win_x0;
            h = l_res->win_y1 - l_res->win_y0;
        } else {
            w = (OPJ_UINT32)(l_res->x1 - l_res->x0);
            h = (OPJ_UINT32)(l_res->y1 - l_res->y0);
        }
        if (h > 0 && UINT_MAX / w < h) {
            return UINT_MAX;
        }
        l_temp = w * h;
        if (l_size_comp && UINT_MAX / l_size_comp < l_temp) {
            return UINT_MAX;
        }
        l_temp *= l_size_comp;

        if (l_temp > UINT_MAX - l_data_size) {
            return UINT_MAX;
        }
        l_data_size += l_temp;
        ++l_img_comp;
        ++l_tile_comp;
    }

    return l_data_size;
}